

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_sound.cpp
# Opt level: O0

void I_InitSound(void)

{
  int iVar1;
  uint uVar2;
  SoundRenderer *pSVar3;
  char *pcVar4;
  
  iVar1 = DArgs::CheckParm(Args,"-nosound",1);
  nosound = iVar1 != 0;
  iVar1 = DArgs::CheckParm(Args,"-nosfx",1);
  nosfx = iVar1 != 0;
  GSnd = (SoundRenderer *)0x0;
  if (((nosound & 1U) == 0) && ((batchrun & 1U) == 0)) {
    pcVar4 = FStringCVar::operator_cast_to_char_(&snd_backend);
    iVar1 = strcasecmp(pcVar4,"null");
    if (iVar1 == 0) {
      pSVar3 = (SoundRenderer *)operator_new(8);
      NullSoundRenderer::NullSoundRenderer((NullSoundRenderer *)pSVar3);
      GSnd = pSVar3;
    }
    else {
      pcVar4 = FStringCVar::operator_cast_to_char_(&snd_backend);
      iVar1 = strcasecmp(pcVar4,"fmod");
      if (iVar1 != 0) {
        pcVar4 = FStringCVar::operator_cast_to_char_(&snd_backend);
        iVar1 = strcasecmp(pcVar4,"openal");
        if (iVar1 != 0) {
          pcVar4 = FStringCVar::operator*(&snd_backend);
          Printf("\x1cG%s: Unknown sound system specified\n",pcVar4);
          FStringCVar::operator=(&snd_backend,"null");
        }
      }
    }
    if ((GSnd == (SoundRenderer *)0x0) ||
       (uVar2 = (*GSnd->_vptr_SoundRenderer[0x1b])(), (uVar2 & 1) == 0)) {
      I_CloseSound();
      pSVar3 = (SoundRenderer *)operator_new(8);
      NullSoundRenderer::NullSoundRenderer((NullSoundRenderer *)pSVar3);
      GSnd = pSVar3;
      Printf("\x1cGSound init failed. Using nosound.\n");
    }
    I_InitMusic();
    FBaseCVar::Callback(&snd_sfxvolume.super_FBaseCVar);
  }
  else {
    pSVar3 = (SoundRenderer *)operator_new(8);
    NullSoundRenderer::NullSoundRenderer((NullSoundRenderer *)pSVar3);
    GSnd = pSVar3;
    I_InitMusic();
  }
  return;
}

Assistant:

void I_InitSound ()
{
	/* Get command line options: */
	nosound = !!Args->CheckParm ("-nosound");
	nosfx = !!Args->CheckParm ("-nosfx");

	GSnd = NULL;
	if (nosound || batchrun)
	{
		GSnd = new NullSoundRenderer;
		I_InitMusic ();
		return;
	}

	// This has been extended to allow falling back from FMod to OpenAL and vice versa if the currently active sound system cannot be found.
	if (stricmp(snd_backend, "null") == 0)
	{
		GSnd = new NullSoundRenderer;
	}
	else if(stricmp(snd_backend, "fmod") == 0)
	{
		#ifndef NO_FMOD
			if (IsFModExPresent())
			{
				GSnd = new FMODSoundRenderer;
			}
		#endif
		#ifndef NO_OPENAL
			if ((!GSnd || !GSnd->IsValid()) && IsOpenALPresent())
			{
				Printf (TEXTCOLOR_RED"FMod Ex Sound init failed. Trying OpenAL.\n");
				I_CloseSound();
				GSnd = new OpenALSoundRenderer;
				snd_backend = "openal";
			}
		#endif
	}
	else if(stricmp(snd_backend, "openal") == 0)
	{
		#ifndef NO_OPENAL
			if (IsOpenALPresent())
			{
				GSnd = new OpenALSoundRenderer;
			}
		#endif
		#ifndef NO_FMOD
			if ((!GSnd || !GSnd->IsValid()) && IsFModExPresent())
			{
				Printf (TEXTCOLOR_RED"OpenAL Sound init failed. Trying FMod Ex.\n");
				I_CloseSound();
				GSnd = new FMODSoundRenderer;
				snd_backend = "fmod";
			}
		#endif
	}
	else
	{
		Printf (TEXTCOLOR_RED"%s: Unknown sound system specified\n", *snd_backend);
		snd_backend = "null";
	}
	if (!GSnd || !GSnd->IsValid ())
	{
		I_CloseSound();
		GSnd = new NullSoundRenderer;
		Printf (TEXTCOLOR_RED"Sound init failed. Using nosound.\n");
	}
	I_InitMusic ();
	snd_sfxvolume.Callback ();
}